

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O0

int xOctaveInit(OctaveNoise *noise,Xoroshiro *xr,PerlinNoise *octaves,double *amplitudes,int omin,
               int len,int nmax)

{
  double dVar1;
  PerlinNoise *noise_00;
  Xoroshiro *xr_00;
  long in_RCX;
  long in_RDX;
  Xoroshiro *in_RSI;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  Xoroshiro pxr;
  int n;
  int i;
  uint64_t xhi;
  uint64_t xlo;
  double persist;
  double lacuna;
  int local_50;
  int local_4c;
  double local_38;
  double local_30;
  
  local_30 = xOctaveInit::lacuna_ini[-in_R8D];
  local_38 = xOctaveInit::persist_ini[in_R9D];
  noise_00 = (PerlinNoise *)xNextLong(in_RSI);
  xr_00 = (Xoroshiro *)xNextLong(in_RSI);
  local_50 = 0;
  for (local_4c = 0; local_4c < in_R9D && local_50 != (int)pxr.lo; local_4c = local_4c + 1) {
    dVar1 = *(double *)(in_RCX + (long)local_4c * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      xPerlinInit(noise_00,xr_00);
      *(double *)(in_RDX + (long)local_50 * 0x140 + 0x120) =
           *(double *)(in_RCX + (long)local_4c * 8) * local_38;
      *(double *)(in_RDX + (long)local_50 * 0x140 + 0x128) = local_30;
      local_50 = local_50 + 1;
    }
    local_30 = local_30 * 2.0;
    local_38 = local_38 * 0.5;
  }
  *(long *)(in_RDI + 2) = in_RDX;
  *in_RDI = local_50;
  return local_50;
}

Assistant:

int xOctaveInit(OctaveNoise *noise, Xoroshiro *xr, PerlinNoise *octaves,
        const double *amplitudes, int omin, int len, int nmax)
{
    static const uint64_t md5_octave_n[][2] = {
        {0xb198de63a8012672, 0x7b84cad43ef7b5a8}, // md5 "octave_-12"
        {0x0fd787bfbc403ec3, 0x74a4a31ca21b48b8}, // md5 "octave_-11"
        {0x36d326eed40efeb2, 0x5be9ce18223c636a}, // md5 "octave_-10"
        {0x082fe255f8be6631, 0x4e96119e22dedc81}, // md5 "octave_-9"
        {0x0ef68ec68504005e, 0x48b6bf93a2789640}, // md5 "octave_-8"
        {0xf11268128982754f, 0x257a1d670430b0aa}, // md5 "octave_-7"
        {0xe51c98ce7d1de664, 0x5f9478a733040c45}, // md5 "octave_-6"
        {0x6d7b49e7e429850a, 0x2e3063c622a24777}, // md5 "octave_-5"
        {0xbd90d5377ba1b762, 0xc07317d419a7548d}, // md5 "octave_-4"
        {0x53d39c6752dac858, 0xbcd1c5a80ab65b3e}, // md5 "octave_-3"
        {0xb4a24d7a84e7677b, 0x023ff9668e89b5c4}, // md5 "octave_-2"
        {0xdffa22b534c5f608, 0xb9b67517d3665ca9}, // md5 "octave_-1"
        {0xd50708086cef4d7c, 0x6e1651ecc7f43309}, // md5 "octave_0"
    };
    static const double lacuna_ini[] = { // -omin = 3..12
        1, .5, .25, 1./8, 1./16, 1./32, 1./64, 1./128, 1./256, 1./512, 1./1024,
        1./2048, 1./4096,
    };
    static const double persist_ini[] = { // len = 4..9
        0, 1, 2./3, 4./7, 8./15, 16./31, 32./63, 64./127, 128./255, 256./511,
    };
#if DEBUG
    if (-omin < 0 || -omin >= (int) (sizeof(lacuna_ini)/sizeof(double)) ||
        len < 0 || len >= (int) (sizeof(persist_ini)/sizeof(double)))
    {
        printf("Fatal: octave initialization out of range\n");
        exit(1);
    }
#endif
    double lacuna = lacuna_ini[-omin];
    double persist = persist_ini[len];
    uint64_t xlo = xNextLong(xr);
    uint64_t xhi = xNextLong(xr);
    int i = 0, n = 0;

    for (; i < len && n != nmax; i++, lacuna *= 2.0, persist *= 0.5)
    {
        if (amplitudes[i] == 0)
            continue;
        Xoroshiro pxr;
        pxr.lo = xlo ^ md5_octave_n[12 + omin + i][0];
        pxr.hi = xhi ^ md5_octave_n[12 + omin + i][1];
        xPerlinInit(&octaves[n], &pxr);
        octaves[n].amplitude = amplitudes[i] * persist;
        octaves[n].lacunarity = lacuna;
        n++;
    }

    noise->octaves = octaves;
    noise->octcnt = n;
    return n;
}